

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history_buffer.c
# Opt level: O2

void history_buffer_traceback
               (history_buffer *buf,shift_register_t bestpath,uint min_traceback_length,
               bit_writer_t *output)

{
  uint uVar1;
  shift_register_t sVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  size_t len;
  bool bVar7;
  
  uVar1 = buf->cap;
  sVar2 = buf->highbit;
  uVar3 = buf->index;
  uVar4 = min_traceback_length;
  while( true ) {
    if (uVar3 == 0) {
      uVar3 = uVar1;
    }
    uVar3 = uVar3 - 1;
    bVar7 = uVar4 == 0;
    uVar4 = uVar4 - 1;
    if (bVar7) break;
    uVar5 = 0;
    if (buf->history[uVar3][bestpath] != '\0') {
      uVar5 = sVar2;
    }
    bestpath = (uVar5 | bestpath) >> 1;
  }
  uVar4 = buf->len;
  for (len = 0; min_traceback_length + (int)len < uVar4; len = len + 1) {
    uVar6 = (ulong)uVar3;
    if (uVar3 == 0) {
      uVar3 = uVar1;
    }
    uVar3 = uVar3 - 1;
    uVar5 = 0;
    if (buf->history[uVar6][bestpath] != '\0') {
      uVar5 = sVar2;
    }
    bestpath = (bestpath | uVar5) >> 1;
    buf->fetched[len] = uVar5 != 0;
  }
  bit_writer_write_bitlist_reversed(output,buf->fetched,len);
  buf->len = buf->len - (int)len;
  return;
}

Assistant:

void history_buffer_traceback(history_buffer *buf, shift_register_t bestpath,
                              unsigned int min_traceback_length, bit_writer_t *output) {
    unsigned int fetched_index = 0;
    shift_register_t highbit = buf->highbit;
    unsigned int index = buf->index;
    unsigned int cap = buf->cap;
    for (unsigned int j = 0; j < min_traceback_length; j++) {
        if (index == 0) {
            index = cap - 1;
        } else {
            index--;
        }
        // we're walking backwards from what the work we did before
        // so, we'll shift high order bits in
        // the path will cross multiple different shift register states, and we determine
        //   which state by going backwards one time slice at a time
        uint8_t history = buf->history[index][bestpath];
        shift_register_t pathbit = history ? highbit : 0;
        bestpath |= pathbit;
        bestpath >>= 1;
    }
    unsigned int prefetch_index = index;
    if (prefetch_index == 0) {
        prefetch_index = cap - 1;
    } else {
        prefetch_index--;
    }
    unsigned int len = buf->len;
    for (unsigned int j = min_traceback_length; j < len; j++) {
        index = prefetch_index;
        if (prefetch_index == 0) {
            prefetch_index = cap - 1;
        } else {
            prefetch_index--;
        }
        prefetch(buf->history[prefetch_index]);
        // we're walking backwards from what the work we did before
        // so, we'll shift high order bits in
        // the path will cross multiple different shift register states, and we determine
        //   which state by going backwards one time slice at a time
        uint8_t history = buf->history[index][bestpath];
        shift_register_t pathbit = history ? highbit : 0;
        bestpath |= pathbit;
        bestpath >>= 1;
        buf->fetched[fetched_index] = (pathbit ? 1 : 0);
        fetched_index++;
    }
    bit_writer_write_bitlist_reversed(output, buf->fetched, fetched_index);
    buf->len -= fetched_index;
}